

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitIteratorTopLevelCatch
               (ByteCodeLabel catchLabel,RegSlot iteratorLocation,RegSlot shouldCallReturnLocation,
               RegSlot shouldCallReturnLocationFinally,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo,bool isAsync)

{
  ByteCodeLabel labelID;
  RegSlot R0;
  ByteCodeLabel labelID_00;
  ByteCodeWriter *pBVar1;
  ByteCodeLabel skipCallCloseLabel;
  RegSlot catchParamLocation;
  ByteCodeLabel afterCatchBlockLabel;
  bool isAsync_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot shouldCallReturnLocationFinally_local;
  RegSlot shouldCallReturnLocation_local;
  RegSlot iteratorLocation_local;
  ByteCodeLabel catchLabel_local;
  
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  labelID = Js::ByteCodeWriter::DefineLabel(pBVar1);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Empty(pBVar1,Leave);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Br(pBVar1,labelID);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::MarkLabel(pBVar1,catchLabel);
  R0 = FuncInfo::AcquireTmpRegister(funcInfo);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Reg1(pBVar1,Catch,R0);
  ByteCodeGenerator::PushJumpCleanupForTry(byteCodeGenerator,ResumeCatch,0,0xffffffff,0xffffffff);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  labelID_00 = Js::ByteCodeWriter::DefineLabel(pBVar1);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::BrReg1(pBVar1,BrFalse_A,labelID_00,shouldCallReturnLocation);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Reg1(pBVar1,LdFalse_ReuseLoc,shouldCallReturnLocationFinally);
  EmitTryCatchAroundIteratorClose(iteratorLocation,labelID_00,byteCodeGenerator,funcInfo,isAsync);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::MarkLabel(pBVar1,labelID_00);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Reg1(pBVar1,Throw,R0);
  FuncInfo::ReleaseTmpRegister(funcInfo,R0);
  ByteCodeGenerator::PopJumpCleanup(byteCodeGenerator);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Empty(pBVar1,Leave);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::MarkLabel(pBVar1,labelID);
  return;
}

Assistant:

void EmitIteratorTopLevelCatch(
    Js::ByteCodeLabel catchLabel,
    Js::RegSlot iteratorLocation,
    Js::RegSlot shouldCallReturnLocation,
    Js::RegSlot shouldCallReturnLocationFinally,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo,
    bool isAsync)
{
    Js::ByteCodeLabel afterCatchBlockLabel = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->Empty(Js::OpCode::Leave);
    byteCodeGenerator->Writer()->Br(afterCatchBlockLabel);
    byteCodeGenerator->Writer()->MarkLabel(catchLabel);

    Js::RegSlot catchParamLocation = funcInfo->AcquireTmpRegister();
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::Catch, catchParamLocation);

    byteCodeGenerator->PushJumpCleanupForTry(Js::OpCode::ResumeCatch);

    Js::ByteCodeLabel skipCallCloseLabel = byteCodeGenerator->Writer()->DefineLabel();

    byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrFalse_A, skipCallCloseLabel, shouldCallReturnLocation);
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnLocationFinally);

    EmitTryCatchAroundIteratorClose(iteratorLocation, skipCallCloseLabel, byteCodeGenerator, funcInfo, isAsync);

    byteCodeGenerator->Writer()->MarkLabel(skipCallCloseLabel);

    // Rethrow the exception
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::Throw, catchParamLocation);
    funcInfo->ReleaseTmpRegister(catchParamLocation);

    byteCodeGenerator->PopJumpCleanup();
    byteCodeGenerator->Writer()->Empty(Js::OpCode::Leave);
    byteCodeGenerator->Writer()->MarkLabel(afterCatchBlockLabel);
}